

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.hpp
# Opt level: O2

string * OpenMD::toString<int>(string *__return_storage_ptr__,int *v)

{
  long *plVar1;
  ostream *poVar2;
  ostringstream oss;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  plVar1 = (long *)std::ostream::operator<<((ostream *)local_190,*v);
  if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"toString Error");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(const T& v) {
    std::ostringstream oss;
    if (!(oss << v)) { std::cerr << "toString Error" << std::endl; }
    return oss.str();
  }